

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

int __thiscall
helics::BrokerBase::parseArgs
          (BrokerBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  undefined8 this_00;
  ParseOutput PVar1;
  shared_ptr<helics::helicsCLI11App> sVar2;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  __shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  undefined1 local_38 [16];
  __shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  sVar2 = generateBaseCLI((BrokerBase *)local_38);
  (*this->_vptr_BrokerBase[8])
            (&_Stack_48,this,
             sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  this_00 = local_38._0_8_;
  std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<helics::helicsCLI11App,void>
            (local_28,&_Stack_48);
  CLI::App::add_subcommand((App *)this_00,(App_p *)local_28);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((helicsCLI11App *)local_38._0_8_,args);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return PVar1;
}

Assistant:

int BrokerBase::parseArgs(std::vector<std::string> args)
{
    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(std::move(args));
    return static_cast<int>(res);
}